

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_ego_min_val(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcStack_30;
  _Bool found;
  char *t;
  char *s;
  ego_item *e;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _Var1 = parser_hasval(p,"min_values");
    if (_Var1) {
      pcVar4 = parser_getstr(p,"min_values");
      pcVar4 = string_make(pcVar4);
      pcStack_30 = strtok(pcVar4," |");
      while ((pcStack_30 != (char *)0x0 &&
             (eVar2 = grab_int_value((int16_t *)((long)pvVar3 + 0x140),obj_mods,pcStack_30),
             eVar2 == 0))) {
        pcStack_30 = strtok((char *)0x0," |");
      }
      string_free(pcVar4);
      p_local._4_4_ = PARSE_ERROR_NONE;
      if (pcStack_30 != (char *)0x0) {
        p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
      }
    }
    else {
      p_local._4_4_ = PARSE_ERROR_MISSING_FIELD;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_ego_min_val(struct parser *p) {
	struct ego_item *e = parser_priv(p);
	char *s, *t;

	if (!e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (!parser_hasval(p, "min_values")) {
		return PARSE_ERROR_MISSING_FIELD;
	}

	s = string_make(parser_getstr(p, "min_values"));
	t = strtok(s, " |");

	while (t) {
		bool found = false;
		if (!grab_int_value(e->min_modifiers, obj_mods, t)) {
			found = true;
		}
		if (!found) {
			break;
		}
		t = strtok(NULL, " |");
	}

	string_free(s);
	return t ? PARSE_ERROR_INVALID_VALUE : PARSE_ERROR_NONE;
}